

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio_test.h
# Opt level: O2

void pair(native_type *fds)

{
  int __fd;
  int iVar1;
  ostream *poVar2;
  socklen_t len;
  int yes;
  sockaddr addr;
  sockaddr local_20;
  
  __fd = socket(2,1,6);
  if (__fd < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(lst) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
  }
  local_20.sa_data[6] = '\0';
  local_20.sa_data[7] = '\0';
  local_20.sa_data[8] = '\0';
  local_20.sa_data[9] = '\0';
  local_20.sa_data[10] = '\0';
  local_20.sa_data[0xb] = '\0';
  local_20.sa_data[0xc] = '\0';
  local_20.sa_data[0xd] = '\0';
  addr.sa_family = 0;
  addr.sa_data[0] = '\0';
  addr.sa_data[1] = '\0';
  addr.sa_data[2] = '\0';
  addr.sa_data[3] = '\0';
  addr.sa_data[4] = '\0';
  addr.sa_data[5] = '\0';
  addr.sa_data[6] = '\0';
  addr.sa_data[7] = '\0';
  addr.sa_data[8] = '\0';
  addr.sa_data[9] = '\0';
  addr.sa_data[10] = '\0';
  addr.sa_data[0xb] = '\0';
  addr.sa_data[0xc] = '\0';
  addr.sa_data[0xd] = '\0';
  local_20.sa_family = 2;
  local_20.sa_data[0] = '\0';
  local_20.sa_data[1] = '\0';
  local_20.sa_data[2] = '\x7f';
  local_20.sa_data[3] = '\0';
  local_20.sa_data[4] = '\0';
  local_20.sa_data[5] = '\x01';
  yes = 1;
  iVar1 = setsockopt(__fd,1,2,&yes,4);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(setsockopt(lst,1,2,(char*)&yes,sizeof(yes))) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3a);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
  }
  iVar1 = bind(__fd,&local_20,0x10);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(bind(lst,(struct sockaddr *)&inaddr,sizeof(inaddr))) >= 0")
    ;
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3b);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
  }
  listen(__fd,1);
  len = 0x10;
  iVar1 = getsockname(__fd,(sockaddr *)&addr,&len);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(getsockname(lst, &addr,&len)) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x43);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
  }
  iVar1 = socket(2,1,0);
  *fds = iVar1;
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(fds[0]) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x45);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
    iVar1 = *fds;
  }
  iVar1 = connect(iVar1,(sockaddr *)&addr,len);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(connect(fds[0],&addr,len)) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x46);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
  }
  iVar1 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
  fds[1] = iVar1;
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(fds[1]) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x48);
    std::endl<char,std::char_traits<char>>(poVar2);
    return_code = 1;
  }
  close(__fd);
  return;
}

Assistant:

inline void pair(booster::aio::native_type fds[2])
{
	using namespace booster::aio;
	struct sockaddr_in inaddr;
	struct sockaddr addr;
	native_type lst=::socket(AF_INET, SOCK_STREAM,IPPROTO_TCP);
	check(lst);
	memset(&inaddr, 0, sizeof(inaddr));
	memset(&addr, 0, sizeof(addr));
	inaddr.sin_family = AF_INET;
	inaddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
	inaddr.sin_port = 0;
	int yes=1;
	check(setsockopt(lst,SOL_SOCKET,SO_REUSEADDR,(char*)&yes,sizeof(yes)));
	check(bind(lst,(struct sockaddr *)&inaddr,sizeof(inaddr)));
	listen(lst,1);
#ifdef BOOSTER_WIN32
	int
#else
	socklen_t 
#endif
	len=sizeof(inaddr);
	check(getsockname(lst, &addr,&len));
	fds[0]=::socket(AF_INET, SOCK_STREAM,0);
	check(fds[0]);
	check(connect(fds[0],&addr,len));
	fds[1]=accept(lst,0,0);
	check(fds[1]);
	closefd(lst);
}